

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

void __thiscall
Fossilize::DatabaseInterface::promote_sub_database_to_whitelist(DatabaseInterface *this,uint index)

{
  Impl *pIVar1;
  iterator __position;
  uint local_4;
  
  pIVar1 = this->impl;
  if (pIVar1->mode == ReadOnly) {
    __position._M_current =
         (pIVar1->sub_databases_in_whitelist).
         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pIVar1->sub_databases_in_whitelist).
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                 &pIVar1->sub_databases_in_whitelist,__position,&local_4);
    }
    else {
      *__position._M_current = index;
      (pIVar1->sub_databases_in_whitelist).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void DatabaseInterface::promote_sub_database_to_whitelist(unsigned index)
{
	if (impl->mode != DatabaseMode::ReadOnly)
		return;

	impl->sub_databases_in_whitelist.push_back(index);
}